

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_description.hpp
# Opt level: O2

void __thiscall duckdb::TableDescription::~TableDescription(TableDescription *this)

{
  ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::~vector
            (&(this->columns).
              super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>);
  ::std::__cxx11::string::~string((string *)&this->table);
  ::std::__cxx11::string::~string((string *)&this->schema);
  ::std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

TableDescription(const string &database_name, const string &schema_name, const string &table_name)
	    : database(database_name), schema(schema_name), table(table_name) {}